

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::error(string *message)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this;
  ostream *poVar1;
  logic_error *this_00;
  function<void_()> fStack_68;
  type func;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,(string *)message);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (options::errorsThrowExceptions != '\x01') {
    this = &func._M_bound_args.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ;
    func._M_f = anon_unknown_1::buildErrorUI;
    func._M_bound_args.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    .super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl =
         (_Head_base<1UL,_bool,_false>)false;
    std::__cxx11::string::string((string *)this,(string *)message);
    (**(code **)(*render::engine + 0x78))();
    std::function<void()>::
    function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
              ((function<void()> *)&fStack_68,&func);
    pushContext(&fStack_68,false);
    std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
    std::__cxx11::string::~string((string *)this);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 options::printPrefix_abi_cxx11_,message);
  std::logic_error::logic_error(this_00,(string *)&func);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void error(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  if (options::errorsThrowExceptions) {
    throw std::logic_error(options::printPrefix + message);
  }

  auto func = std::bind(buildErrorUI, message, false);
  
  render::engine->showWindow();
  pushContext(func, false);
}